

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O3

void rw::writeTGA(Image *image,char *filename)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint8 *puVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  byte *pbVar7;
  size_t __n;
  ushort uVar8;
  int iVar9;
  int __fd;
  StreamFile *pSVar10;
  ulong uVar11;
  byte *pbVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  StreamFile local_60;
  byte *local_50;
  TGAHeader local_44;
  
  local_60.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00148c08;
  local_60.file = (void *)0x0;
  iVar5 = StreamFile::open(&local_60,filename,0x13308b);
  if (CONCAT44(extraout_var,iVar5) == 0) {
    writeTGA((rw *)filename);
  }
  else {
    local_44.IDlen = '\0';
    puVar4 = image->palette;
    bVar13 = puVar4 == (uint8 *)0x0;
    local_44.colorMapType = !bVar13;
    local_44.imageType = bVar13 + '\x01';
    local_44.colorMapOrigin = 0;
    uVar3 = image->depth;
    local_44.colorMapDepth = !bVar13 << 5;
    uVar8 = 0x10;
    if (uVar3 != 4) {
      uVar8 = (ushort)(uVar3 == 8) << 8;
    }
    local_44.xOrigin = 0;
    local_44.yOrigin = 0;
    uVar1 = image->width;
    uVar2 = image->height;
    auVar14._4_4_ = uVar2;
    auVar14._0_4_ = uVar1;
    auVar14._8_8_ = 0;
    auVar14 = pshuflw(auVar14,auVar14,0xe8);
    local_44._14_4_ = auVar14._0_4_;
    __n = 8;
    if (uVar3 != 4) {
      __n = (size_t)uVar3;
    }
    local_44.depth = (uint8)__n;
    local_44.descriptor = (uVar3 == 0x20) << 3 | 0x20;
    pSVar10 = &local_60;
    local_44.colorMapLength = uVar8;
    TGAHeader::write(&local_44,(int)pSVar10,(void *)((ulong)(uVar3 == 8) << 8),__n);
    if ((puVar4 != (uint8 *)0x0) && (puVar4 = image->palette, uVar8 != 0 && puVar4 != (uint8 *)0x0))
    {
      uVar11 = 0;
      do {
        Stream::writeU8(&local_60.super_Stream,puVar4[uVar11 * 4 + 2]);
        Stream::writeU8(&local_60.super_Stream,puVar4[uVar11 * 4 + 1]);
        Stream::writeU8(&local_60.super_Stream,puVar4[uVar11 * 4]);
        pSVar10 = (StreamFile *)(ulong)puVar4[uVar11 * 4 + 3];
        Stream::writeU8(&local_60.super_Stream,puVar4[uVar11 * 4 + 3]);
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
    __fd = (int)pSVar10;
    iVar5 = image->height;
    if (0 < iVar5) {
      pbVar12 = image->pixels;
      iVar6 = image->width;
      iVar9 = 0;
      do {
        if (0 < iVar6) {
          iVar5 = 0;
          local_50 = pbVar12;
          do {
            pbVar7 = pbVar12;
            switch(image->depth << 0x1e | image->depth - 4U >> 2) {
            case 0:
            case 1:
              break;
            default:
              goto switchD_00112bee_caseD_2;
            case 3:
              Stream::writeU8(&local_60.super_Stream,*pbVar12);
              pbVar7 = pbVar12 + 1;
              break;
            case 5:
              Stream::writeU8(&local_60.super_Stream,pbVar12[2]);
              Stream::writeU8(&local_60.super_Stream,pbVar12[1]);
              break;
            case 7:
              Stream::writeU8(&local_60.super_Stream,pbVar12[2]);
              Stream::writeU8(&local_60.super_Stream,pbVar12[1]);
              Stream::writeU8(&local_60.super_Stream,*pbVar12);
              pbVar7 = pbVar12 + 3;
            }
            pSVar10 = (StreamFile *)(ulong)*pbVar7;
            Stream::writeU8(&local_60.super_Stream,*pbVar7);
switchD_00112bee_caseD_2:
            pbVar12 = pbVar12 + image->bpp;
            iVar5 = iVar5 + 1;
            iVar6 = image->width;
          } while (iVar5 < iVar6);
          iVar5 = image->height;
          pbVar12 = local_50;
        }
        __fd = (int)pSVar10;
        pbVar12 = pbVar12 + image->stride;
        iVar9 = iVar9 + 1;
      } while (iVar9 < iVar5);
    }
    StreamFile::close(&local_60,__fd);
  }
  return;
}

Assistant:

void
writeTGA(Image *image, const char *filename)
{
	TGAHeader header;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}
	header.IDlen = 0;
	header.imageType = image->palette != nil ? 1 : 2;
	header.colorMapType = image->palette != nil;
	header.colorMapOrigin = 0;
	header.colorMapLength = image->depth == 4 ? 16 :
	                        image->depth == 8 ? 256 : 0;
	header.colorMapDepth = image->palette ? 32 : 0;
	header.xOrigin = 0;
	header.yOrigin = 0;
	header.width = image->width;
	header.height = image->height;
	header.depth = image->depth == 4 ? 8 : image->depth;
	header.descriptor = 0x20 | (image->depth == 32 ? 8 : 0);
	header.write(&file);

	uint8 *palette = header.colorMapType ? image->palette : nil;
	uint8 (*color)[4] = (uint8(*)[4])palette;;
	if(palette)
		for(int i = 0; i < header.colorMapLength; i++){
			file.writeU8(color[i][2]);
			file.writeU8(color[i][1]);
			file.writeU8(color[i][0]);
			file.writeU8(color[i][3]);
		}

	uint8 *line = image->pixels;
	uint8 *p;
	for(int y = 0; y < image->height; y++){
		p = line;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
			case 8:
				file.writeU8(p[0]);
				break;
			case 16:
				file.writeU8(p[0]);
				file.writeU8(p[1]);
				break;
			case 24:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				break;
			case 32:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				file.writeU8(p[3]);
				break;
			}
			p += image->bpp;
		}
		line += image->stride;
	}
	file.close();
}